

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pocketsphinx.c
# Opt level: O1

int ps_set_alignment(ps_decoder_t *ps,ps_alignment_t *al)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  ps_alignment_t *al_00;
  ps_search_t *search;
  ps_seg_t *ppVar4;
  
  if (al == (ps_alignment_t *)0x0) {
    ppVar4 = ps_seg_iter(ps);
    if (ppVar4 == (ps_seg_t *)0x0) {
      uVar3 = 1;
      al_00 = (ps_alignment_t *)0x0;
      bVar1 = false;
    }
    else {
      al_00 = ps_alignment_init(ps->d2p);
      do {
        if (ppVar4->wid == -1) {
          err_msg(ERR_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/pocketsphinx.c"
                  ,0x2ed,"No word ID for segment %s, cannot align\n",ppVar4->text);
          uVar3 = 4;
          goto LAB_0010d3b1;
        }
        ps_alignment_add_word(al_00,ppVar4->wid,ppVar4->sf,(ppVar4->ef - ppVar4->sf) + 1);
        ppVar4 = (*ppVar4->vt->seg_next)(ppVar4);
      } while (ppVar4 != (ps_seg_t *)0x0);
      uVar3 = ps_alignment_populate(al_00);
      uVar3 = uVar3 >> 0x1d & 0xfffffffc;
LAB_0010d3b1:
      bVar1 = true;
    }
    if (uVar3 != 0) {
      if (uVar3 != 4) {
        return -1;
      }
      goto LAB_0010d3c3;
    }
  }
  else {
    al_00 = ps_alignment_retain(al);
    bVar1 = false;
  }
  search = state_align_search_init("_state_align",ps->config,ps->acmod,al_00);
  if (search != (ps_search_t *)0x0) {
    if (bVar1) {
      ps_alignment_free(al_00);
    }
    iVar2 = set_search_internal(ps,search);
    if (-1 < iVar2) {
      iVar2 = ps_activate_search(ps,"_state_align");
      return iVar2;
    }
  }
LAB_0010d3c3:
  if (bVar1) {
    ps_alignment_free(al_00);
  }
  return -1;
}

Assistant:

int
ps_set_alignment(ps_decoder_t *ps, ps_alignment_t *al)
{
    ps_search_t *search;
    int new_alignment = FALSE;
    
    if (al == NULL) {
        ps_seg_t *seg;
        seg = ps_seg_iter(ps);
        if (seg == NULL)
            return -1;
        al = ps_alignment_init(ps->d2p);
        new_alignment = TRUE;
        while (seg) {
            if (seg->wid == BAD_S3WID) {
                E_ERROR("No word ID for segment %s, cannot align\n",
                        seg->text);
                goto error_out;
            }
            ps_alignment_add_word(al, seg->wid, seg->sf, seg->ef - seg->sf + 1);
            seg = ps_seg_next(seg);
        }
        /* FIXME: Add cionly parameter as in SoundSwallower */
        if (ps_alignment_populate(al) < 0)
            goto error_out;
    }
    else
        al = ps_alignment_retain(al);
    search = state_align_search_init("_state_align", ps->config, ps->acmod, al);
    if (search == NULL)
        goto error_out;
    if (new_alignment)
        ps_alignment_free(al);
    if (set_search_internal(ps, search) < 0)
        goto error_out;
    return ps_activate_search(ps, "_state_align");
error_out:
    if (new_alignment)
        ps_alignment_free(al);
    return -1;
}